

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmAuxTable.cpp
# Opt level: O3

GMM_AUXTTL1e __thiscall
GmmLib::AuxTable::CreateAuxL1Data(AuxTable *this,GMM_RESOURCE_INFO *BaseResInfo)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar5 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x25])
                    (BaseResInfo);
  uVar7 = 0;
  if (uVar5 - 1 < 0x180) {
    uVar7 = (ulong)uVar5;
  }
  iVar6 = (*((this->super_PageTable).pClientContext)->_vptr_GmmClientContext[3])();
  lVar3 = *(long *)(CONCAT44(extraout_var,iVar6) + 8);
  uVar1 = *(ushort *)(lVar3 + 0x181c + uVar7 * 0x14);
  uVar5 = *(uint *)(lVar3 + 0x1828 + uVar7 * 0x14);
  iVar6 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])
                    (BaseResInfo);
  uVar2 = *(uint *)(CONCAT44(extraout_var_00,iVar6) + 8);
  iVar6 = (*((this->super_PageTable).pClientContext)->_vptr_GmmClientContext[3])();
  uVar9 = 2;
  if ((*(uint *)(CONCAT44(extraout_var_01,iVar6) + 0x44) >> 0x10 & 1) == 0) {
    uVar9 = (ulong)(uVar2 >> 0x1c & 2);
  }
  iVar6 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])
                    (BaseResInfo);
  uVar10 = *(ulong *)(CONCAT44(extraout_var_02,iVar6) + 8);
  bVar4 = GmmIsPlanar((GMM_RESOURCE_FORMAT)uVar7);
  uVar8 = (ulong)(bVar4 & 1) << 0x39;
  uVar10 = (uVar8 | (ulong)uVar5 << 0x3a | (uVar10 & 0x4000000000) << 0xe | uVar9) ^
           0x10000000000000;
  iVar6 = (*((this->super_PageTable).pClientContext)->_vptr_GmmClientContext[3])();
  if (((*(byte *)(CONCAT44(extraout_var_03,iVar6) + 0x46) & 2) != 0) &&
     (iVar6 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x24])
                        (BaseResInfo), iVar6 == 6)) {
    uVar10 = uVar8 | uVar9 | 0x4180000000000000;
  }
  iVar6 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])
                    (BaseResInfo);
  if ((*(byte *)(CONCAT44(extraout_var_04,iVar6) + 0xb) & 0x20) != 0) {
    iVar6 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x24])
                      (BaseResInfo);
    if (iVar6 == 6) {
      return (GMM_AUXTTL1e)uVar10;
    }
    if (uVar1 < 0x20) {
      if (uVar1 == 8) {
        return (GMM_AUXTTL1e)(uVar10 & 0xfe3fffffffffffff | 0x100000000000000);
      }
      if (uVar1 == 0x10) {
        return (GMM_AUXTTL1e)(uVar10 & 0xfe3fffffffffffff);
      }
    }
    else {
      if (uVar1 == 0x20) {
        uVar10 = uVar10 & 0xfe3fffffffffffff;
        uVar7 = 0x140000000000000;
        goto LAB_001b6f3d;
      }
      if (uVar1 == 0x40) {
        uVar10 = uVar10 & 0xfe3fffffffffffff;
        uVar7 = 0x180000000000000;
        goto LAB_001b6f3d;
      }
      if (uVar1 == 0x80) {
        uVar7 = 0x1c0000000000000;
        goto LAB_001b6f3d;
      }
    }
    uVar10 = uVar10 & 0xfe3fffffffffffff;
    uVar7 = 0xc0000000000000;
    goto LAB_001b6f3d;
  }
  uVar5 = (GMM_RESOURCE_FORMAT)uVar7 - GMM_FORMAT_P010;
  if (uVar5 < 0x14) {
    if ((0x28002U >> (uVar5 & 0x1f) & 1) == 0) {
      if ((0xc0004U >> (uVar5 & 0x1f) & 1) == 0) {
        if ((0x4001U >> (uVar5 & 0x1f) & 1) == 0) goto LAB_001b6f00;
        uVar10 = uVar10 & 0xfe3fffffffffffff | 0x40000000000000;
      }
      else {
        uVar10 = uVar10 & 0xfe3fffffffffffff;
      }
    }
    else {
      uVar10 = uVar10 & 0xfe3fffffffffffff | 0x80000000000000;
    }
  }
  else {
LAB_001b6f00:
    uVar10 = uVar10 & 0xfe3fffffffffffff | 0xc0000000000000;
  }
  if ((uint)(uVar10 >> 0x3a) != 0x18) {
    return (GMM_AUXTTL1e)uVar10;
  }
  uVar10 = uVar10 & 0x3ffffffffffffff;
  uVar7 = 0x3800000000000000;
LAB_001b6f3d:
  return (GMM_AUXTTL1e)(uVar10 | uVar7);
}

Assistant:

GMM_AUXTTL1e GmmLib::AuxTable::CreateAuxL1Data(GMM_RESOURCE_INFO *BaseResInfo)
{
    GMM_RESOURCE_FORMAT Format;
    Format = BaseResInfo->GetResourceFormat();
    Format = ((Format > GMM_FORMAT_INVALID) && (Format < GMM_RESOURCE_FORMATS)) ? Format : GMM_FORMAT_INVALID;

    GMM_FORMAT_ENTRY FormatInfo = pClientContext->GetLibContext()->GetPlatformInfo().FormatTable[Format];
    GMM_AUXTTL1e     L1ePartial = {0};
#define GMM_REGISTRY_UMD_PATH "SOFTWARE\\Intel\\IGFX\\GMM\\"
#define GMM_E2EC_OVERRIDEDEPTH16BPPTO12 "ForceYUV16To12BPP"

    L1ePartial.Mode = BaseResInfo->GetResFlags().Info.RenderCompressed ? 0x1 : 0x0; //MC on VCS supports all compression modes,
                                                                                    //MC on Render pipe only 128B compr (until B-step)
    //Recognize which .MC surfaces needs Render pipe access
    if(pClientContext->GetLibContext()->GetWaTable().WaLimit128BMediaCompr)
    {
        L1ePartial.Mode = 0x1; //Limit media compression to 128B (same as RC) on gen12LP A0
    }

    //L1ePartial.Lossy = 0; // when to set it
    L1ePartial.TileMode = BaseResInfo->GetResFlags().Info.TiledYs ? 0 : 1;

    L1ePartial.Format     = FormatInfo.CompressionFormat.AuxL1eFormat;
    L1ePartial.LumaChroma = GmmIsPlanar(Format);

    if(pClientContext->GetLibContext()->GetWaTable().WaUntypedBufferCompression && BaseResInfo->GetResourceType() == RESOURCE_BUFFER)
    {
        //Gen12LP WA to support untyped raw buffer compression on HDC ie MLC(machine-learning compression)
        L1ePartial.TileMode = 0;
        L1ePartial.Depth    = 0x6;
        L1ePartial.Format   = GMM_E2ECOMP_FORMAT_RGBAFLOAT16;
    }

    __GMM_ASSERT(L1ePartial.Format > GMM_E2ECOMP_MIN_FORMAT && //Are we going to reuse 0x00 for uncompressed indication? CCS contains that info, but only known by HW
                 L1ePartial.Format <= GMM_E2ECOMP_MAX_FORMAT); //Could SW use it as surface-wide uncompressed state indicator? If so, remove teh assert (Need to make sure, all format encodings are correct)

    if(BaseResInfo->GetResFlags().Info.RenderCompressed)
    {
        if(BaseResInfo->GetResourceType() != RESOURCE_BUFFER)
        {
            switch(FormatInfo.Element.BitsPer)
            {
                case 8:
                    L1ePartial.Depth = 0x4;
                    break;
                case 16:
                    L1ePartial.Depth = 0x0;
                    break;
                case 32:
                    L1ePartial.Depth = 0x5;
                    break;
                case 64:
                    L1ePartial.Depth = 0x6;
                    break;
                case 128:
                    L1ePartial.Depth = 0x7;
                    break;
                default:
                    L1ePartial.Depth = 0x3;
            }
        }
    }
    else
    {
        switch(Format)
        {
            case GMM_FORMAT_P012:
            case GMM_FORMAT_Y412:
            case GMM_FORMAT_Y212: //which format encoding for Y212, Y412, P012?
                L1ePartial.Depth = 0x2;
                break;
            case GMM_FORMAT_P010:
            //case GMM_FORMAT_Y410:
            case GMM_FORMAT_Y210: //which format encoding for Y210?
                L1ePartial.Depth = 0x1;
                break;
            case GMM_FORMAT_P016: //per HAS, separate encoding than P010, but a comment says to use P010 in AuxTable?
            case GMM_FORMAT_Y416:
            case GMM_FORMAT_Y216:
                L1ePartial.Depth = 0x0;
                break;
            default:
                L1ePartial.Depth = 0x3; //For MC, bpp got from format encoding
        }

        if(L1ePartial.Format == GMM_E2ECOMP_FORMAT_R10G10B10A2_UNORM)
        {
            L1ePartial.Format = GMM_E2ECOMP_FORMAT_RGB10b;
        }
    }

    return L1ePartial;
}